

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O0

void stats_print(_func_void_void_ptr_char_ptr *write_cb,void *cbopaque,char *opts)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  long in_RDX;
  void *in_RSI;
  _func_void_void_ptr_char_ptr *in_RDI;
  emitter_t emitter;
  uint i;
  _Bool extents;
  _Bool mutex;
  _Bool large;
  _Bool bins;
  _Bool unmerged;
  _Bool destroyed;
  _Bool merged;
  _Bool general;
  _Bool json;
  size_t u64sz;
  uint64_t epoch;
  int err;
  emitter_t *in_stack_00000240;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  void *in_stack_ffffffffffffff98;
  size_t *in_stack_ffffffffffffffa0;
  _func_void_void_ptr_char_ptr *in_stack_ffffffffffffffa8;
  char *in_stack_ffffffffffffffb0;
  uint local_40;
  _Bool local_39;
  _Bool local_38;
  _Bool local_37;
  _Bool local_36;
  _Bool local_35;
  _Bool local_34;
  _Bool local_33;
  
  bVar1 = false;
  bVar2 = true;
  local_33 = true;
  local_34 = true;
  local_35 = true;
  local_36 = true;
  local_37 = true;
  local_38 = true;
  local_39 = true;
  iVar3 = je_mallctl(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0,
                     in_stack_ffffffffffffff98,
                     CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
  if (iVar3 == 0) {
    if (in_RDX != 0) {
      for (local_40 = 0; *(char *)(in_RDX + (ulong)local_40) != '\0'; local_40 = local_40 + 1) {
        switch(*(undefined1 *)(in_RDX + (ulong)local_40)) {
        case 0x4a:
          bVar1 = true;
          break;
        default:
          break;
        case 0x61:
          local_35 = false;
          break;
        case 0x62:
          local_36 = false;
          break;
        case 100:
          local_34 = false;
          break;
        case 0x65:
          local_39 = false;
          break;
        case 0x67:
          bVar2 = false;
          break;
        case 0x6c:
          local_37 = false;
          break;
        case 0x6d:
          local_33 = false;
          break;
        case 0x78:
          local_38 = false;
        }
      }
    }
    emitter_init((emitter_t *)&stack0xffffffffffffffa0,(uint)!bVar1,in_RDI,in_RSI);
    emitter_begin((emitter_t *)0x258e24);
    emitter_table_printf
              ((emitter_t *)&stack0xffffffffffffffa0,"___ Begin jemalloc statistics ___\n");
    emitter_json_object_kv_begin
              ((emitter_t *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90),
               (char *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
    if (bVar2) {
      stats_general_print(in_stack_00000240);
    }
    stats_print_helper((emitter_t *)&stack0xffffffffffffffa0,local_33,local_34,local_35,local_36,
                       local_37,local_38,local_39);
    emitter_json_object_end((emitter_t *)0x258ec6);
    emitter_table_printf((emitter_t *)&stack0xffffffffffffffa0,"--- End jemalloc statistics ---\n");
    emitter_end((emitter_t *)0x258ee3);
  }
  else {
    if (iVar3 != 0xb) {
      malloc_write((char *)0x258d40);
      abort();
    }
    malloc_write((char *)0x258d2f);
  }
  return;
}

Assistant:

void
stats_print(void (*write_cb)(void *, const char *), void *cbopaque,
    const char *opts) {
	int err;
	uint64_t epoch;
	size_t u64sz;
#define OPTION(o, v, d, s) bool v = d;
	STATS_PRINT_OPTIONS
#undef OPTION

	/*
	 * Refresh stats, in case mallctl() was called by the application.
	 *
	 * Check for OOM here, since refreshing the ctl cache can trigger
	 * allocation.  In practice, none of the subsequent mallctl()-related
	 * calls in this function will cause OOM if this one succeeds.
	 * */
	epoch = 1;
	u64sz = sizeof(uint64_t);
	err = je_mallctl("epoch", (void *)&epoch, &u64sz, (void *)&epoch,
	    sizeof(uint64_t));
	if (err != 0) {
		if (err == EAGAIN) {
			malloc_write("<jemalloc>: Memory allocation failure in "
			    "mallctl(\"epoch\", ...)\n");
			return;
		}
		malloc_write("<jemalloc>: Failure in mallctl(\"epoch\", "
		    "...)\n");
		abort();
	}

	if (opts != NULL) {
		for (unsigned i = 0; opts[i] != '\0'; i++) {
			switch (opts[i]) {
#define OPTION(o, v, d, s) case o: v = s; break;
				STATS_PRINT_OPTIONS
#undef OPTION
			default:;
			}
		}
	}

	emitter_t emitter;
	emitter_init(&emitter,
	    json ? emitter_output_json : emitter_output_table, write_cb,
	    cbopaque);
	emitter_begin(&emitter);
	emitter_table_printf(&emitter, "___ Begin jemalloc statistics ___\n");
	emitter_json_object_kv_begin(&emitter, "jemalloc");

	if (general) {
		stats_general_print(&emitter);
	}
	if (config_stats) {
		stats_print_helper(&emitter, merged, destroyed, unmerged,
		    bins, large, mutex, extents);
	}

	emitter_json_object_end(&emitter); /* Closes the "jemalloc" dict. */
	emitter_table_printf(&emitter, "--- End jemalloc statistics ---\n");
	emitter_end(&emitter);
}